

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O0

bool __thiscall Assimp::X3DImporter::ParseHelper_CheckRead_X3DMetadataObject(X3DImporter *this)

{
  bool bVar1;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  X3DImporter *local_18;
  X3DImporter *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"MetadataBoolean",&local_39);
  bVar1 = XML_CheckNode_NameEqual(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar1) {
    ParseNode_MetadataBoolean(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"MetadataDouble",&local_71);
    bVar1 = XML_CheckNode_NameEqual(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (bVar1) {
      ParseNode_MetadataDouble(this);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"MetadataFloat",&local_99);
      bVar1 = XML_CheckNode_NameEqual(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      if (bVar1) {
        ParseNode_MetadataFloat(this);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"MetadataInteger",&local_c1);
        bVar1 = XML_CheckNode_NameEqual(this,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        if (bVar1) {
          ParseNode_MetadataInteger(this);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"MetadataSet",&local_e9);
          bVar1 = XML_CheckNode_NameEqual(this,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
          if (bVar1) {
            ParseNode_MetadataSet(this);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_110,"MetadataString",&local_111);
            bVar1 = XML_CheckNode_NameEqual(this,&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            std::allocator<char>::~allocator(&local_111);
            if (!bVar1) {
              return false;
            }
            ParseNode_MetadataString(this);
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool X3DImporter::ParseHelper_CheckRead_X3DMetadataObject()
{
	if(XML_CheckNode_NameEqual("MetadataBoolean"))
		ParseNode_MetadataBoolean();
	else if(XML_CheckNode_NameEqual("MetadataDouble"))
		ParseNode_MetadataDouble();
	else if(XML_CheckNode_NameEqual("MetadataFloat"))
		ParseNode_MetadataFloat();
	else if(XML_CheckNode_NameEqual("MetadataInteger"))
		ParseNode_MetadataInteger();
	else if(XML_CheckNode_NameEqual("MetadataSet"))
		ParseNode_MetadataSet();
	else if(XML_CheckNode_NameEqual("MetadataString"))
		ParseNode_MetadataString();
	else
		return false;

	return true;
}